

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deBlockBuffer.hpp
# Opt level: O1

void __thiscall de::BlockBuffer<unsigned_char>::~BlockBuffer(BlockBuffer<unsigned_char> *this)

{
  if (this->m_elements != (uchar *)0x0) {
    operator_delete__(this->m_elements);
  }
  if (this->m_numUsedInBlock != (int *)0x0) {
    operator_delete__(this->m_numUsedInBlock);
  }
  deSemaphore_destroy(this->m_fill);
  deSemaphore_destroy(this->m_empty);
  Mutex::~Mutex(&this->m_readLock);
  Mutex::~Mutex(&this->m_writeLock);
  return;
}

Assistant:

BlockBuffer<T>::~BlockBuffer (void)
{
	delete[] m_elements;
	delete[] m_numUsedInBlock;

	deSemaphore_destroy(m_fill);
	deSemaphore_destroy(m_empty);
}